

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_end(mz_zip_archive *pZip)

{
  mz_zip_internal_state *__s;
  mz_bool status;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip_local;
  
  if (((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
       (pZip->m_pAlloc == (mz_alloc_func)0x0)) || (pZip->m_pFree == (mz_free_func)0x0)) ||
     ((pZip->m_zip_mode != MZ_ZIP_MODE_WRITING &&
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED)))) {
    pZip_local._4_4_ = 0;
  }
  else {
    __s = pZip->m_pState;
    pZip->m_pState = (mz_zip_internal_state *)0x0;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_central_dir).m_p);
    memset(__s,0,0x20);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_central_dir_offsets).m_p);
    memset(&__s->m_central_dir_offsets,0,0x20);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(__s->m_sorted_central_dir_offsets).m_p);
    memset(&__s->m_sorted_central_dir_offsets,0,0x20);
    if (__s->m_pFile != (FILE *)0x0) {
      fclose((FILE *)__s->m_pFile);
      __s->m_pFile = (FILE *)0x0;
    }
    if ((pZip->m_pWrite == (anonymous_namespace)::miniz::mz_zip_heap_write_func) &&
       (__s->m_pMem != (void *)0x0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,__s->m_pMem);
      __s->m_pMem = (void *)0x0;
    }
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,__s);
    pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
    pZip_local._4_4_ = 1;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_end(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState;
  mz_bool status = MZ_TRUE;
  if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) ||
      ((pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) &&
       (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED)))
    return MZ_FALSE;

  pState = pZip->m_pState;
  pZip->m_pState = NULL;
  mz_zip_array_clear(pZip, &pState->m_central_dir);
  mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
  mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
  if (pState->m_pFile) {
    MZ_FCLOSE(pState->m_pFile);
    pState->m_pFile = NULL;
  }
#endif // #ifndef MINIZ_NO_STDIO

  if ((pZip->m_pWrite == mz_zip_heap_write_func) && (pState->m_pMem)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState->m_pMem);
    pState->m_pMem = NULL;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
  pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
  return status;
}